

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constexpr_parser.h
# Opt level: O2

char * absl::lts_20250127::str_format_internal::ConsumeConversion<false>
                 (char *pos,char *end,UnboundConversion *conv,int *next_arg)

{
  Flags FVar1;
  bool bVar2;
  FormatConversionChar FVar3;
  int iVar4;
  byte *pbVar5;
  char *pcVar6;
  Flags FVar7;
  ConvTag tag;
  ConvTag tag_1;
  byte local_43;
  ConvTag local_42;
  ConvTag local_41;
  byte *local_40;
  int *local_38;
  
  if (pos != end) {
    pbVar5 = (byte *)(pos + 1);
    local_43 = *pos;
    local_40 = pbVar5;
    if (conv->flags != kBasic) {
      __assert_fail("conv->flags == Flags::kBasic",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                    ,0xee,
                    "const char *absl::str_format_internal::ConsumeConversion(const char *, const char *const, UnboundConversion *, int *) [is_positional = false]"
                   );
    }
    if ((char)local_43 < 'A') {
      FVar7 = kBasic;
      local_38 = next_arg;
      while (next_arg = local_38, local_40 = pbVar5, (char)local_43 < '1') {
        local_41.tag_ = ConvTagHolder::value[local_43].tag_;
        if ((local_41.tag_ & 0xe0) != 0xc0) {
          if (local_43 == 0x2a) {
            conv->flags = FVar7 | kNonBasic;
            if (pbVar5 == (byte *)end) {
              return (char *)0x0;
            }
            local_40 = pbVar5 + 1;
            local_43 = *pbVar5;
            iVar4 = *local_38;
            *local_38 = iVar4 + 1;
            UnboundConversion::InputValue::set_from_arg(&conv->width,iVar4 + 1);
          }
          else if (local_43 == 0x30) goto LAB_00d14af1;
          goto LAB_00d14b74;
        }
        FVar1 = ConvTag::as_flags(&local_41);
        FVar7 = FVar7 | FVar1;
        conv->flags = FVar7;
        if (local_40 == (byte *)end) {
          return (char *)0x0;
        }
        pbVar5 = local_40 + 1;
        local_43 = *local_40;
      }
      if (local_43 < 0x3a) {
LAB_00d14af1:
        iVar4 = ParseDigits((char *)&local_43,(char **)&local_40,end);
        if (local_43 == 0x24) {
          if (*next_arg != 0) {
            return (char *)0x0;
          }
          *next_arg = -1;
          pcVar6 = ConsumeConversion<true>(pos,end,conv,next_arg);
          return pcVar6;
        }
        conv->flags = conv->flags | kNonBasic;
        UnboundConversion::InputValue::set_value(&conv->width,iVar4);
      }
LAB_00d14b74:
      if (local_43 == 0x2e) {
        conv->flags = conv->flags | kNonBasic;
        if (local_40 == (byte *)end) {
          return (char *)0x0;
        }
        pbVar5 = local_40 + 1;
        local_43 = *local_40;
        if ((byte)(local_43 - 0x30) < 10) {
          local_40 = pbVar5;
          iVar4 = ParseDigits((char *)&local_43,(char **)&local_40,end);
          UnboundConversion::InputValue::set_value(&conv->precision,iVar4);
        }
        else if (local_43 == 0x2a) {
          if (pbVar5 == (byte *)end) {
            return (char *)0x0;
          }
          local_43 = local_40[1];
          iVar4 = *next_arg;
          *next_arg = iVar4 + 1;
          local_40 = local_40 + 2;
          UnboundConversion::InputValue::set_from_arg(&conv->precision,iVar4 + 1);
        }
        else {
          (conv->precision).value_ = 0;
          local_40 = pbVar5;
        }
      }
    }
    local_42.tag_ = ConvTagHolder::value[local_43].tag_;
    if (((local_43 != 0x76) || (conv->flags == kBasic)) && (-1 < (char)local_42.tag_)) {
      bVar2 = CheckFastPathSetting(conv);
      if (!bVar2) {
        __assert_fail("CheckFastPathSetting(*conv)",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                      ,0x14d,
                      "const char *absl::str_format_internal::ConsumeConversion(const char *, const char *const, UnboundConversion *, int *) [is_positional = false]"
                     );
      }
      FVar3 = ConvTag::as_conv(&local_42);
      conv->conv = FVar3;
      iVar4 = *next_arg;
      *next_arg = iVar4 + 1;
      conv->arg_position = iVar4 + 1;
      return (char *)local_40;
    }
  }
  return (char *)0x0;
}

Assistant:

constexpr const char* ConsumeConversion(const char* pos, const char* const end,
                                        UnboundConversion* conv,
                                        int* next_arg) {
  const char* const original_pos = pos;
  char c = 0;
  // Read the next char into `c` and update `pos`. Returns false if there are
  // no more chars to read.
#define ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR()          \
  do {                                                  \
    if (ABSL_PREDICT_FALSE(pos == end)) return nullptr; \
    c = *pos++;                                         \
  } while (0)

  if (is_positional) {
    ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
    if (ABSL_PREDICT_FALSE(c < '1' || c > '9')) return nullptr;
    conv->arg_position = ParseDigits(c, pos, end);
    assert(conv->arg_position > 0);
    if (ABSL_PREDICT_FALSE(c != '$')) return nullptr;
  }

  ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();

  // We should start with the basic flag on.
  assert(conv->flags == Flags::kBasic);

  // Any non alpha character makes this conversion not basic.
  // This includes flags (-+ #0), width (1-9, *) or precision (.).
  // All conversion characters and length modifiers are alpha characters.
  if (c < 'A') {
    while (c <= '0') {
      auto tag = GetTagForChar(c);
      if (tag.is_flags()) {
        conv->flags = conv->flags | tag.as_flags();
        ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
      } else {
        break;
      }
    }

    if (c <= '9') {
      if (c >= '0') {
        int maybe_width = ParseDigits(c, pos, end);
        if (!is_positional && c == '$') {
          if (ABSL_PREDICT_FALSE(*next_arg != 0)) return nullptr;
          // Positional conversion.
          *next_arg = -1;
          return ConsumeConversion<true>(original_pos, end, conv, next_arg);
        }
        conv->flags = conv->flags | Flags::kNonBasic;
        conv->width.set_value(maybe_width);
      } else if (c == '*') {
        conv->flags = conv->flags | Flags::kNonBasic;
        ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
        if (is_positional) {
          if (ABSL_PREDICT_FALSE(c < '1' || c > '9')) return nullptr;
          conv->width.set_from_arg(ParseDigits(c, pos, end));
          if (ABSL_PREDICT_FALSE(c != '$')) return nullptr;
          ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
        } else {
          conv->width.set_from_arg(++*next_arg);
        }
      }
    }

    if (c == '.') {
      conv->flags = conv->flags | Flags::kNonBasic;
      ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
      if ('0' <= c && c <= '9') {
        conv->precision.set_value(ParseDigits(c, pos, end));
      } else if (c == '*') {
        ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
        if (is_positional) {
          if (ABSL_PREDICT_FALSE(c < '1' || c > '9')) return nullptr;
          conv->precision.set_from_arg(ParseDigits(c, pos, end));
          if (c != '$') return nullptr;
          ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
        } else {
          conv->precision.set_from_arg(++*next_arg);
        }
      } else {
        conv->precision.set_value(0);
      }
    }
  }

  auto tag = GetTagForChar(c);

  if (ABSL_PREDICT_FALSE(c == 'v' && conv->flags != Flags::kBasic)) {
    return nullptr;
  }

  if (ABSL_PREDICT_FALSE(!tag.is_conv())) {
    if (ABSL_PREDICT_FALSE(!tag.is_length())) return nullptr;

    // It is a length modifier.
    LengthMod length_mod = tag.as_length();
    ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
    if (c == 'h' && length_mod == LengthMod::h) {
      conv->length_mod = LengthMod::hh;
      ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
    } else if (c == 'l' && length_mod == LengthMod::l) {
      conv->length_mod = LengthMod::ll;
      ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
    } else {
      conv->length_mod = length_mod;
    }
    tag = GetTagForChar(c);

    if (ABSL_PREDICT_FALSE(c == 'v')) return nullptr;
    if (ABSL_PREDICT_FALSE(!tag.is_conv())) return nullptr;

    // `wchar_t` args are marked non-basic so `Bind()` will copy the length mod.
    if (conv->length_mod == LengthMod::l && c == 'c') {
      conv->flags = conv->flags | Flags::kNonBasic;
    }
  }
#undef ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR

  assert(CheckFastPathSetting(*conv));
  (void)(&CheckFastPathSetting);

  conv->conv = tag.as_conv();
  if (!is_positional) conv->arg_position = ++*next_arg;
  return pos;
}